

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryFill(Replacer *this,MemoryFill *curr)

{
  string_view memory;
  Index index;
  Index sizeIdx_00;
  Function *pFVar1;
  LocalSet *localSet;
  Expression *pEVar2;
  LocalGet *pLVar3;
  Index sizeIdx;
  Index valueIdx;
  MemoryFill *curr_local;
  Replacer *this_local;
  
  if ((this->parent->checkBounds & 1U) == 0) {
    pEVar2 = getDest<wasm::MemoryFill>
                       (this,curr,(Name)(curr->memory).super_IString.str,0xffffffff,
                        (Expression *)0x0,(Expression *)0x0);
    curr->dest = pEVar2;
  }
  else {
    pFVar1 = Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
             ::getFunction(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                          );
    index = Builder::addVar(pFVar1,(Type)(this->parent->pointerType).id);
    pFVar1 = Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
             ::getFunction(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                          );
    sizeIdx_00 = Builder::addVar(pFVar1,(Type)(this->parent->pointerType).id);
    memory = (curr->memory).super_IString.str;
    localSet = Builder::makeLocalSet(&this->builder,index,curr->value);
    pEVar2 = getDest<wasm::MemoryFill>
                       (this,curr,(Name)memory,sizeIdx_00,(Expression *)localSet,(Expression *)0x0);
    curr->dest = pEVar2;
    pLVar3 = Builder::makeLocalGet(&this->builder,index,(Type)(this->parent->pointerType).id);
    curr->value = (Expression *)pLVar3;
    pLVar3 = Builder::makeLocalGet(&this->builder,sizeIdx_00,(Type)(this->parent->pointerType).id);
    curr->size = (Expression *)pLVar3;
  }
  setMemory<wasm::MemoryFill>(this,curr);
  return;
}

Assistant:

void visitMemoryFill(MemoryFill* curr) {
      if (parent.checkBounds) {
        Index valueIdx = Builder::addVar(getFunction(), parent.pointerType);
        Index sizeIdx = Builder::addVar(getFunction(), parent.pointerType);
        curr->dest = getDest(curr,
                             curr->memory,
                             sizeIdx,
                             builder.makeLocalSet(valueIdx, curr->value));
        curr->value = builder.makeLocalGet(valueIdx, parent.pointerType);
        curr->size = builder.makeLocalGet(sizeIdx, parent.pointerType);
      } else {
        curr->dest = getDest(curr, curr->memory);
      }
      setMemory(curr);
    }